

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kakuro.cc
# Opt level: O1

void solve(grid *b,uint idx)

{
  run *prVar1;
  bool bVar2;
  uint uVar3;
  undefined8 in_RAX;
  long *plVar4;
  _Base_bitset<1UL> _Var5;
  _Base_bitset<1UL> _Var6;
  logic_error *this;
  uint uVar7;
  ulong uVar8;
  undefined8 uStack_38;
  
  uVar7 = b->cols_;
  uVar3 = b->rows_ * uVar7;
  while( true ) {
    if (uVar3 <= idx) {
      uStack_38 = in_RAX;
      if (uVar3 != 0) {
        uVar8 = 0;
        do {
          if ((int)((uVar8 & 0xffffffff) % (ulong)uVar7) == 0) {
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
            std::ostream::put(-0x28);
            std::ostream::flush();
          }
          if ((b->cells_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8] == 0xffffffff) {
            uStack_38 = CONCAT17(0x2e,(undefined7)uStack_38);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)((long)&uStack_38 + 7),1);
          }
          else {
            std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          }
          uVar8 = uVar8 + 1;
          uVar7 = b->cols_;
        } while (uVar8 < b->rows_ * uVar7);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      plVar4 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      return;
    }
    if ((b->cells_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[idx] != 0xffffffff) break;
    idx = idx + 1;
  }
  prVar1 = (b->runs_).super__Vector_base<grid::run_pair,_std::allocator<grid::run_pair>_>._M_impl.
           super__Vector_impl_data._M_start[idx].r_[0];
  if (prVar1 == (run *)0x0) {
    _Var5._M_w = 0;
  }
  else {
    _Var5._M_w = (_WordT)feasible_addend_set(prVar1);
  }
  prVar1 = (b->runs_).super__Vector_base<grid::run_pair,_std::allocator<grid::run_pair>_>._M_impl.
           super__Vector_impl_data._M_start[idx].r_[1];
  if (prVar1 == (run *)0x0) {
    _Var6._M_w = 0;
  }
  else {
    _Var6._M_w = (_WordT)feasible_addend_set(prVar1);
  }
  uVar8 = 1;
  do {
    if (((_Var6._M_w & _Var5._M_w) >> (uVar8 & 0x3f) & 1) != 0) {
      bVar2 = grid::put(b,idx,(uint)uVar8);
      if (!bVar2) {
        this = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this,"duplicate trial number");
        __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      solve(b,idx + 1);
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 != 10);
  grid::put(b,idx,0);
  return;
}

Assistant:

static void solve(grid &b, unsigned idx)
{
	/* if we come this far, the grid contains a solution */
	if(idx >= b.rows_ * b.cols_) {
		print(b);
		return;
	}

	/*
	  for coding simplicity, we always recurse, even on nonfillable cells.
	  so skip them here..
	*/
	if(b.cells_[idx] == -1U) {
		solve(b, idx+1);
		return;
	}

	bitset<10> trial_numbers = feasible_numbers(b, idx);
	for(unsigned i = 1; i < 10; i++)
		if(trial_numbers[i]) {
			/*
			  putting should always succeed since the trial number set is
			  calculated so that it contains only not present numbers.
			*/
			if(!b.put(idx, i))
				throw logic_error("duplicate trial number");
			solve(b, idx+1);
		}

	/* UNDO number placement before backtracking */
	b.put(idx, 0);
}